

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

int __thiscall CVmObjTable::restore(CVmObjTable *this,CVmFile *fp,CVmObjFixup **fixups)

{
  obj_fixup_entry *poVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  uint uVar4;
  CVmObjFixup *pCVar5;
  CVmObjPageEntry **ppCVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  CVmObjTable *pCVar11;
  char b [4];
  char buf [2];
  uint local_40;
  char local_3a;
  byte local_39;
  CVmObjTable *local_38;
  
  *fixups = (CVmObjFixup *)0x0;
  iVar2 = CVmMetaTable::read_from_file(G_meta_table_X,fp);
  if (iVar2 == 0) {
    local_38 = this;
    reset_to_image(&G_obj_table_X);
    CVmFile::read_bytes(fp,(char *)&local_40,4);
    uVar10 = (ulong)local_40;
    pCVar5 = (CVmObjFixup *)operator_new(0x20);
    CVmObjFixup::CVmObjFixup(pCVar5,uVar10);
    *fixups = pCVar5;
    if (uVar10 != 0) {
      do {
        CVmFile::read_bytes(fp,(char *)&local_40,4);
        uVar4 = local_40;
        CVmFile::read_bytes(fp,(char *)&local_40,4);
        vVar3 = 0;
        if ((local_40 & 1) == 0) {
          vVar3 = alloc_obj(&G_obj_table_X,0,1,1);
        }
        pCVar5 = *fixups;
        uVar7 = pCVar5->used_;
        pCVar5->used_ = uVar7 + 1;
        poVar1 = pCVar5->arr_[uVar7 >> 0xb];
        uVar9 = (uint)uVar7 & 0x7ff;
        poVar1[uVar9].old_id = uVar4;
        poVar1[uVar9].new_id = vVar3;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    CVmFile::read_bytes(fp,(char *)&local_40,4);
    pCVar11 = local_38;
    for (uVar10 = (ulong)local_40; iVar2 = 0, uVar10 != 0; uVar10 = uVar10 - 1) {
      CVmFile::read_bytes(fp,(char *)&local_40,4);
      uVar4 = local_40;
      CVmFile::read_bytes(fp,&local_3a,2);
      if (local_3a == '\0') {
        uVar9 = (uint)local_39;
        uVar4 = CVmObjFixup::get_new_id(*fixups,uVar4);
        pCVar11 = local_38;
        CVmMetaTable::create_for_restore(G_meta_table_X,uVar9,uVar4);
        ppCVar6 = pCVar11->pages_;
        uVar7 = (ulong)(uVar4 >> 0xc);
        uVar8 = (ulong)(uVar4 & 0xfff);
      }
      else {
        if ((uVar4 == 0) || ((uint)((int)pCVar11->pages_used_ << 0xc) <= uVar4)) {
          return 0x4b6;
        }
        ppCVar6 = pCVar11->pages_;
        uVar7 = (ulong)(uVar4 >> 0xc);
        uVar8 = (ulong)(uVar4 & 0xfff);
        if ((ppCVar6[uVar7][uVar8].field_0x14 & 1) != 0) {
          return 0x4b6;
        }
      }
      (**(code **)(*(long *)&ppCVar6[uVar7][uVar8].ptr_ + 0xf0))
                (ppCVar6[uVar7] + uVar8,uVar4,fp,*fixups);
    }
  }
  return iVar2;
}

Assistant:

int CVmObjTable::restore(VMG_ CVmFile *fp, CVmObjFixup **fixups)
{
    int err;
    ulong cnt;

    /* presume we won't create a fixup table */
    *fixups = 0;
    
    /* load the metaclass table */
    if ((err = G_meta_table->read_from_file(fp)) != 0)
        return err;

    /* 
     *   Reset all objects to the initial image file load state.  Note that
     *   we wait until after we've read the metaclass table to reset the
     *   objects, because any intrinsic class objects in the root set will
     *   need to re-initialize their presence in the metaclass table, which
     *   they can't do until after the metaclass table has itself been
     *   reloaded. 
     */
    G_obj_table->reset_to_image(vmg0_);

    /* read the size of the table of contents */
    cnt = fp->read_uint4();

    /* allocate the fixup table */
    *fixups = new CVmObjFixup(cnt);

    /* read the fixup table */
    for ( ; cnt != 0 ; --cnt)
    {
        vm_obj_id_t old_id;
        vm_obj_id_t new_id;
        ulong flags;
        
        /* read the next entry */
        old_id = (vm_obj_id_t)fp->read_uint4();
        flags = fp->read_uint4();
        
        /* 
         *   Allocate a new object ID for this entry.  If the object was
         *   transient, then it won't actually have been saved, so we must
         *   fix up references to the object to nil.  
         */
        if (!(flags & VMOBJ_TOC_TRANSIENT))
            new_id = vm_new_id(vmg_ FALSE);
        else
            new_id = VM_INVALID_OBJ;
        
        /* 
         *   Add the entry.  Note that the table of contents is stored in
         *   ascending order of old ID (i.e., the ID's in the saved state
         *   file's numbering system); this is the same ordering required by
         *   the fixup table, so we can simply read entries from the file
         *   and add them directly to the fixup table.  
         */
        (*fixups)->add_fixup(old_id, new_id);
    }
    
    /* read the number of saved objects */
    cnt = fp->read_uint4();
    
    /* read the objects */
    for ( ; cnt != 0 ; --cnt)
    {
        char buf[2];
        vm_obj_id_t id;
        int in_root_set;
        uint meta_idx;
        CVmObject *obj;
        
        /* read the original object ID */
        id = (vm_obj_id_t)fp->read_uint4();

        /* read the root-set flag and dependency table index */
        fp->read_bytes(buf, 2);
        in_root_set = buf[0];
        meta_idx = (uchar)buf[1];

        /* 
         *   if it's not in the root set, we need to create a new object;
         *   otherwise, the object must already exist, since it came from
         *   the object file 
         */
        if (in_root_set)
        {
            /* 
             *   make sure the object is valid - since it's supposedly in
             *   the root set, it must already exist 
             */
            if (!is_obj_id_valid(id) || get_entry(id)->free_)
                return VMERR_SAVED_OBJ_ID_INVALID;
        }
        else
        {
            /* 
             *   the object was dynamically allocated, so it will have a new
             *   object number - fix up the object ID to the new numbering
             *   system 
             */
            id = (*fixups)->get_new_id(vmg_ id);

            /* create the object */
            G_meta_table->create_for_restore(vmg_ meta_idx, id);
        }

        /* read the object's data */
        obj = get_obj(id);
        obj->restore_from_file(vmg_ id, fp, *fixups);
    }
    
    /* success */
    return 0;
}